

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::ObjectIntersector1<true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  AABBNodeMB4D *node1;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  RTCIntersectFunctionN p_Var12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  float fVar22;
  undefined4 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  float fVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  int mask;
  NodeRef stack [564];
  ulong *local_1358;
  int local_134c;
  ulong local_1348;
  RayQueryContext *local_1340;
  Ray *local_1338;
  long local_1330;
  long local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1358 = local_11d8 + 1;
      aVar2 = (ray->dir).field_0.field_1;
      auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar18 = vandps_avx512vl((undefined1  [16])aVar2,auVar18);
      auVar25._8_4_ = 0x219392ef;
      auVar25._0_8_ = 0x219392ef219392ef;
      auVar25._12_4_ = 0x219392ef;
      uVar15 = vcmpps_avx512vl(auVar18,auVar25,1);
      bVar3 = (bool)((byte)uVar15 & 1);
      auVar19._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
      bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar19._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
      bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar19._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
      bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar19._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
      auVar18 = vrcp14ps_avx512vl(auVar19);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar20 = vfnmadd213ps_avx512vl(auVar19,auVar18,auVar20);
      auVar19 = vfmadd132ps_fma(auVar20,auVar18,auVar18);
      fVar22 = auVar19._0_4_;
      local_11f8._4_4_ = fVar22;
      local_11f8._0_4_ = fVar22;
      local_11f8._8_4_ = fVar22;
      local_11f8._12_4_ = fVar22;
      local_11f8._16_4_ = fVar22;
      local_11f8._20_4_ = fVar22;
      local_11f8._24_4_ = fVar22;
      local_11f8._28_4_ = fVar22;
      auVar33 = ZEXT3264(local_11f8);
      auVar18 = vmovshdup_avx(auVar19);
      uVar24 = auVar18._0_8_;
      local_1218._8_8_ = uVar24;
      local_1218._0_8_ = uVar24;
      local_1218._16_8_ = uVar24;
      local_1218._24_8_ = uVar24;
      auVar34 = ZEXT3264(local_1218);
      auVar20 = vshufpd_avx(auVar19,auVar19,1);
      auVar26._8_4_ = 2;
      auVar26._0_8_ = 0x200000002;
      auVar26._12_4_ = 2;
      auVar26._16_4_ = 2;
      auVar26._20_4_ = 2;
      auVar26._24_4_ = 2;
      auVar26._28_4_ = 2;
      fVar28 = fVar22 * (ray->org).field_0.m128[0];
      local_1238 = vpermps_avx2(auVar26,ZEXT1632(auVar19));
      auVar35 = ZEXT3264(local_1238);
      auVar30._8_4_ = 1;
      auVar30._0_8_ = 0x100000001;
      auVar30._12_4_ = 1;
      auVar30._16_4_ = 1;
      auVar30._20_4_ = 1;
      auVar30._24_4_ = 1;
      auVar30._28_4_ = 1;
      auVar21 = ZEXT1632(CONCAT412(auVar19._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar19._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar19._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar28))));
      auVar30 = vpermps_avx2(auVar30,auVar21);
      auVar26 = vpermps_avx2(auVar26,auVar21);
      uVar15 = (ulong)(fVar22 < 0.0) << 5;
      uVar17 = (ulong)(auVar18._0_4_ < 0.0) << 5 | 0x40;
      uVar13 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x80;
      uVar16 = uVar15 ^ 0x20;
      uVar23 = auVar4._0_4_;
      local_1258._4_4_ = uVar23;
      local_1258._0_4_ = uVar23;
      local_1258._8_4_ = uVar23;
      local_1258._12_4_ = uVar23;
      local_1258._16_4_ = uVar23;
      local_1258._20_4_ = uVar23;
      local_1258._24_4_ = uVar23;
      local_1258._28_4_ = uVar23;
      auVar29 = ZEXT3264(local_1258);
      local_1278._4_4_ = fVar1;
      local_1278._0_4_ = fVar1;
      local_1278._8_4_ = fVar1;
      local_1278._12_4_ = fVar1;
      local_1278._16_4_ = fVar1;
      local_1278._20_4_ = fVar1;
      local_1278._24_4_ = fVar1;
      local_1278._28_4_ = fVar1;
      auVar32 = ZEXT3264(local_1278);
      local_1298._0_8_ = CONCAT44(fVar28,fVar28) ^ 0x8000000080000000;
      local_1298._8_4_ = -fVar28;
      local_1298._12_4_ = -fVar28;
      local_1298._16_4_ = -fVar28;
      local_1298._20_4_ = -fVar28;
      local_1298._24_4_ = -fVar28;
      local_1298._28_4_ = -fVar28;
      auVar36 = ZEXT3264(local_1298);
      local_12b8._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      local_12b8._8_4_ = auVar30._8_4_ ^ 0x80000000;
      local_12b8._12_4_ = auVar30._12_4_ ^ 0x80000000;
      local_12b8._16_4_ = auVar30._16_4_ ^ 0x80000000;
      local_12b8._20_4_ = auVar30._20_4_ ^ 0x80000000;
      local_12b8._24_4_ = auVar30._24_4_ ^ 0x80000000;
      local_12b8._28_4_ = auVar30._28_4_ ^ 0x80000000;
      auVar31 = ZEXT3264(local_12b8);
      local_12d8._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      local_12d8._8_4_ = auVar26._8_4_ ^ 0x80000000;
      local_12d8._12_4_ = auVar26._12_4_ ^ 0x80000000;
      local_12d8._16_4_ = auVar26._16_4_ ^ 0x80000000;
      local_12d8._20_4_ = auVar26._20_4_ ^ 0x80000000;
      local_12d8._24_4_ = auVar26._24_4_ ^ 0x80000000;
      local_12d8._28_4_ = auVar26._28_4_ ^ 0x80000000;
      auVar27 = ZEXT3264(local_12d8);
      local_1348 = uVar15;
      local_1340 = context;
      local_1338 = ray;
LAB_01c7bafa:
      if (local_1358 != local_11d8) {
        uVar14 = local_1358[-1];
        local_1358 = local_1358 + -1;
LAB_01c7bb17:
        uVar23 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
        auVar21._4_4_ = uVar23;
        auVar21._0_4_ = uVar23;
        auVar21._8_4_ = uVar23;
        auVar21._12_4_ = uVar23;
        auVar21._16_4_ = uVar23;
        auVar21._20_4_ = uVar23;
        auVar21._24_4_ = uVar23;
        auVar21._28_4_ = uVar23;
        while ((uVar14 & 8) == 0) {
          uVar9 = uVar14 & 0xfffffffffffffff0;
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar15),auVar21,
                                   *(undefined1 (*) [32])(uVar9 + 0x40 + uVar15));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar33._0_32_,auVar36._0_32_);
          auVar30 = vmaxps_avx(auVar29._0_32_,ZEXT1632(auVar4));
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar17),auVar21,
                                   *(undefined1 (*) [32])(uVar9 + 0x40 + uVar17));
          auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar13),auVar21,
                                    *(undefined1 (*) [32])(uVar9 + 0x40 + uVar13));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar34._0_32_,auVar31._0_32_);
          auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar35._0_32_,auVar27._0_32_);
          auVar26 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar18));
          auVar30 = vmaxps_avx(auVar30,auVar26);
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + uVar16),auVar21,
                                   *(undefined1 (*) [32])(uVar9 + 0x40 + uVar16));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar33._0_32_,auVar36._0_32_);
          auVar26 = vminps_avx(auVar32._0_32_,ZEXT1632(auVar4));
          auVar4 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar17 ^ 0x20)),auVar21,
                                   *(undefined1 (*) [32])(uVar9 + 0x40 + (uVar17 ^ 0x20)));
          auVar18 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar9 + 0x100 + (uVar13 ^ 0x20)),auVar21,
                                    *(undefined1 (*) [32])(uVar9 + 0x40 + (uVar13 ^ 0x20)));
          auVar4 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar34._0_32_,auVar31._0_32_);
          auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar35._0_32_,auVar27._0_32_);
          auVar5 = vminps_avx(ZEXT1632(auVar4),ZEXT1632(auVar18));
          auVar26 = vminps_avx(auVar26,auVar5);
          if (((uint)uVar14 & 7) == 6) {
            uVar24 = vcmpps_avx512vl(auVar30,auVar26,2);
            uVar6 = vcmpps_avx512vl(auVar21,*(undefined1 (*) [32])(uVar9 + 0x1c0),0xd);
            uVar7 = vcmpps_avx512vl(auVar21,*(undefined1 (*) [32])(uVar9 + 0x1e0),1);
            uVar10 = (uint)uVar24 & (uint)uVar6 & (uint)uVar7;
          }
          else {
            uVar24 = vcmpps_avx512vl(auVar30,auVar26,2);
            uVar10 = (uint)uVar24;
          }
          if ((byte)uVar10 == 0) goto LAB_01c7bafa;
          lVar8 = 0;
          for (uVar14 = (ulong)(byte)uVar10; (uVar14 & 1) == 0;
              uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar8 = lVar8 + 1;
          }
          uVar14 = *(ulong *)(uVar9 + lVar8 * 8);
          uVar10 = (uVar10 & 0xff) - 1 & uVar10 & 0xff;
          uVar11 = (ulong)uVar10;
          if (uVar10 != 0) goto LAB_01c7bc39;
        }
        local_1330 = (ulong)((uint)uVar14 & 0xf) - 8;
        for (local_1328 = 0; local_1330 != local_1328; local_1328 = local_1328 + 1) {
          local_1320.geomID = *(uint *)((uVar14 & 0xfffffffffffffff0) + local_1328 * 8);
          local_12f0 = (context->scene->geometries).items[local_1320.geomID].ptr;
          if ((ray->mask & local_12f0->mask) != 0) {
            local_1320.primID = *(uint *)((uVar14 & 0xfffffffffffffff0) + 4 + local_1328 * 8);
            local_134c = -1;
            local_1320.valid = &local_134c;
            local_1320.geometryUserPtr = local_12f0->userPtr;
            local_1320.context = context->user;
            local_1320.N = 1;
            local_12e8 = 0;
            local_12e0 = context->args;
            p_Var12 = local_12e0->intersect;
            if (p_Var12 == (RTCIntersectFunctionN)0x0) {
              p_Var12 = (RTCIntersectFunctionN)
                        local_12f0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                        _M_i;
            }
            local_1320.rayhit = (RTCRayHitN *)ray;
            (*p_Var12)(&local_1320);
            auVar33 = ZEXT3264(local_11f8);
            auVar34 = ZEXT3264(local_1218);
            auVar35 = ZEXT3264(local_1238);
            auVar29 = ZEXT3264(local_1258);
            auVar32 = ZEXT3264(local_1278);
            auVar36 = ZEXT3264(local_1298);
            auVar31 = ZEXT3264(local_12b8);
            auVar27 = ZEXT3264(local_12d8);
            context = local_1340;
            ray = local_1338;
            uVar15 = local_1348;
            if (local_1338->tfar < 0.0) {
              local_1338->tfar = -INFINITY;
              return;
            }
          }
        }
        goto LAB_01c7bafa;
      }
    }
  }
  return;
LAB_01c7bc39:
  do {
    *local_1358 = uVar14;
    local_1358 = local_1358 + 1;
    lVar8 = 0;
    for (uVar14 = uVar11; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
      lVar8 = lVar8 + 1;
    }
    uVar11 = uVar11 - 1 & uVar11;
    uVar14 = *(ulong *)(uVar9 + lVar8 * 8);
  } while (uVar11 != 0);
  goto LAB_01c7bb17;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }